

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O0

int Saig_DetectTryPolarity
              (sat_solver *pSat,int nConfs,int nProps,Cnf_Dat_t *pCnf,Aig_Obj_t *pObj,int iPol,
              Vec_Ptr_t *vInfo,int *piPat,int fVerbose)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  lit local_4c;
  lit local_48;
  int Lits [2];
  int status;
  Aig_Obj_t *pOut;
  int iPol_local;
  Aig_Obj_t *pObj_local;
  Cnf_Dat_t *pCnf_local;
  int nProps_local;
  int nConfs_local;
  sat_solver *pSat_local;
  
  register0x00000000 = Aig_ManCo(pCnf->pMan,0);
  piVar1 = pCnf->pVarNums;
  iVar2 = Aig_ObjId(register0x00000000);
  local_4c = toLitCond(piVar1[iVar2],0);
  piVar1 = pCnf->pVarNums;
  iVar2 = Aig_ObjId(pObj);
  local_48 = toLitCond(piVar1[iVar2],(uint)((iPol != 0 ^ 0xffU) & 1));
  Lits[0] = sat_solver_solve(pSat,&local_4c,Lits,(long)nConfs,(long)nProps,0,0);
  if (Lits[0] == -1) {
    pSat_local._4_4_ = 1;
  }
  else if (Lits[0] == 0) {
    pSat_local._4_4_ = 0;
  }
  else {
    if (Lits[0] != 1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                    ,0x220,
                    "int Saig_DetectTryPolarity(sat_solver *, int, int, Cnf_Dat_t *, Aig_Obj_t *, int, Vec_Ptr_t *, int *, int)"
                   );
    }
    Saig_CollectSatValues(pSat,pCnf,vInfo,piPat);
    *piPat = *piPat + 1;
    iVar2 = *piPat;
    iVar3 = Vec_PtrReadWordsSimInfo(vInfo);
    if (iVar2 == iVar3 << 5) {
      if (fVerbose != 0) {
        printf("Warning: Reached the limit on the number of patterns.\n");
      }
      *piPat = 0;
    }
    pSat_local._4_4_ = 0;
  }
  return pSat_local._4_4_;
}

Assistant:

int Saig_DetectTryPolarity( sat_solver * pSat, int nConfs, int nProps, Cnf_Dat_t * pCnf, Aig_Obj_t * pObj, int iPol, Vec_Ptr_t * vInfo, int * piPat, int fVerbose )
{
    Aig_Obj_t * pOut = Aig_ManCo( pCnf->pMan, 0 );
    int status, Lits[2];
//    ABC_INT64_T nOldConfs = pSat->stats.conflicts;
//    ABC_INT64_T nOldImps = pSat->stats.propagations;
    Lits[0] = toLitCond( pCnf->pVarNums[Aig_ObjId(pOut)], 0 );
    Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !iPol );
    status = sat_solver_solve( pSat, Lits, Lits + 2, (ABC_INT64_T)nConfs, (ABC_INT64_T)nProps, 0, 0 );
    if ( status == l_False )
    {
//        printf( "u%d(%d) ", (int)(pSat->stats.conflicts-nOldConfs), (int)(pSat->stats.propagations-nOldImps) );
        return 1;
    }
    if ( status == l_Undef )
    {
//        printf( "Solver returned undecided.\n" );
        return 0;
    }
//    printf( "s%d(%d) ", (int)(pSat->stats.conflicts-nOldConfs), (int)(pSat->stats.propagations-nOldImps) );
    assert( status == l_True );
    Saig_CollectSatValues( pSat, pCnf, vInfo, piPat );
    (*piPat)++;
    if ( *piPat == Vec_PtrReadWordsSimInfo(vInfo) * 32 )
    {
        if ( fVerbose )
            printf( "Warning: Reached the limit on the number of patterns.\n" );
        *piPat = 0;
    }
    return 0;
}